

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

bool absl::anon_unknown_0::HandleEdgeCase<double>(ParsedFloat *input,bool negative,double *value)

{
  long *plVar1;
  double dVar2;
  double dVar3;
  float local_f8;
  double local_e0;
  double local_d8;
  char *nan_argument;
  long local_c0;
  ptrdiff_t nan_size;
  char n_char_sequence [128];
  ptrdiff_t kNanBufferSize;
  double *value_local;
  bool negative_local;
  ParsedFloat *input_local;
  
  if (input->type == kNan) {
    if (input->subrange_begin == (char *)0x0) {
      nan_size._0_1_ = 0;
    }
    else {
      local_c0 = (long)input->subrange_end - (long)input->subrange_begin;
      nan_argument = (char *)0x7f;
      plVar1 = std::min<long>(&local_c0,(long *)&nan_argument);
      local_c0 = *plVar1;
      std::copy_n<char_const*,long,char*>(input->subrange_begin,local_c0,(char *)&nan_size);
      n_char_sequence[local_c0 + -8] = '\0';
    }
    if (negative) {
      local_d8 = FloatTraits<double>::MakeNan((char *)&nan_size);
      local_d8 = -local_d8;
    }
    else {
      local_d8 = FloatTraits<double>::MakeNan((char *)&nan_size);
    }
    *value = local_d8;
    input_local._7_1_ = true;
  }
  else if (input->type == kInfinity) {
    dVar2 = std::numeric_limits<double>::infinity();
    dVar3 = std::numeric_limits<double>::infinity();
    local_e0 = -dVar2;
    if (!negative) {
      local_e0 = dVar3;
    }
    *value = local_e0;
    input_local._7_1_ = true;
  }
  else if (input->mantissa == 0) {
    local_f8 = -0.0;
    if (!negative) {
      local_f8 = 0.0;
    }
    *value = (double)local_f8;
    input_local._7_1_ = true;
  }
  else {
    input_local._7_1_ = false;
  }
  return input_local._7_1_;
}

Assistant:

bool HandleEdgeCase(const strings_internal::ParsedFloat& input, bool negative,
                    FloatType* absl_nonnull value) {
  if (input.type == strings_internal::FloatType::kNan) {
    // A bug in gcc would cause the compiler to optimize away the buffer we are
    // building below.  Declaring the buffer volatile avoids the issue, and has
    // no measurable performance impact in microbenchmarks.
    //
    // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=86113
    constexpr ptrdiff_t kNanBufferSize = 128;
#if (defined(__GNUC__) && !defined(__clang__))
    volatile char n_char_sequence[kNanBufferSize];
#else
    char n_char_sequence[kNanBufferSize];
#endif
    if (input.subrange_begin == nullptr) {
      n_char_sequence[0] = '\0';
    } else {
      ptrdiff_t nan_size = input.subrange_end - input.subrange_begin;
      nan_size = std::min(nan_size, kNanBufferSize - 1);
      std::copy_n(input.subrange_begin, nan_size, n_char_sequence);
      n_char_sequence[nan_size] = '\0';
    }
    char* nan_argument = const_cast<char*>(n_char_sequence);
    *value = negative ? -FloatTraits<FloatType>::MakeNan(nan_argument)
                      : FloatTraits<FloatType>::MakeNan(nan_argument);
    return true;
  }
  if (input.type == strings_internal::FloatType::kInfinity) {
    *value = negative ? -std::numeric_limits<FloatType>::infinity()
                      : std::numeric_limits<FloatType>::infinity();
    return true;
  }
  if (input.mantissa == 0) {
    *value = negative ? -0.0f : 0.0f;
    return true;
  }
  return false;
}